

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFeeder.cpp
# Opt level: O2

bool __thiscall
chrono::ChFeeder::IntLoadConstraint_Ct(unsigned_int,Eigen::Matrix<double,-1,1,0,-1,1>&,double)::
MyContactCallback::OnReportContact(chrono::ChVector<double>const&,chrono::
ChVector<double>const&,chrono::ChMatrix33<double>const&,double_const&,double_const&,chrono::
ChVector<double>const&,chrono::ChVector<double>const&,chrono::ChContactable*,chrono::
ChContactable__int_(void *this,ChVector<double> *pA,ChVector<double> *pB,
                   ChMatrix33<double> *plane_coord,double *distance,double *eff_radius,
                   ChVector<double> *react_forces,ChVector<double> *react_torques,
                   ChContactable *contactobjA,ChContactable *contactobjB,int offset)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChVector<double> v;
  ChVector<double> contact_pseudovel;
  ChVector<double> pseudovel;
  ChVector<double> local_a0;
  ChVector<double> local_88;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_68;
  double local_60;
  ulong local_58;
  ulong local_50;
  ChVector<double> local_48;
  
  std::__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)((long)this + 8) + 0x78));
  if ((ChContactable *)local_a0.m_data[0] == contactobjA) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0.m_data + 1));
  }
  else {
    std::__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
               (__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)this + 8) + 0x78));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88.m_data + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0.m_data + 1));
    if ((ChContactable *)local_88.m_data[0] != contactobjB) {
      return true;
    }
  }
  ChFrame<double>::TransformParentToLocal
            (&local_a0,(ChFrame<double> *)(*(long *)((long)this + 8) + 0x88),pB);
  lVar2 = *(long *)((long)this + 8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_a0.m_data[0];
  auVar11._8_8_ = local_a0.m_data[2];
  auVar11._0_8_ = local_a0.m_data[2];
  auVar4._8_8_ = local_a0.m_data[2];
  auVar4._0_8_ = local_a0.m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(lVar2 + 0x128);
  auVar9._8_8_ = *(undefined8 *)(lVar2 + 0x138);
  auVar9._0_8_ = *(undefined8 *)(lVar2 + 0x138);
  auVar7 = vunpcklpd_avx(auVar11,auVar7);
  auVar8 = vunpcklpd_avx(auVar9,auVar6);
  auVar10._0_8_ = local_a0.m_data[1] * auVar8._0_8_;
  auVar10._8_8_ = local_a0.m_data[2] * auVar8._8_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_a0.m_data[0] * SUB168(*(undefined1 (*) [16])(lVar2 + 0x130),0);
  auVar8 = vfmsub231sd_fma(auVar8,auVar6,auVar4);
  local_88.m_data[2] = auVar8._0_8_ + *(double *)(lVar2 + 0x120);
  auVar7 = vfmsub213pd_fma(auVar7,*(undefined1 (*) [16])(lVar2 + 0x130),auVar10);
  local_88.m_data[0] = auVar7._0_8_ + *(double *)(lVar2 + 0x110);
  local_88.m_data[1] = auVar7._8_8_ + *(double *)(lVar2 + 0x118);
  ChMatrix33<double>::operator*((ChMatrix33<double> *)(lVar2 + 200),&local_88);
  local_68.m_matrix = &plane_coord->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_68,&local_48);
  bVar3 = local_60 < 0.0;
  dVar1 = *(double *)((long)this + 0x18);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (*(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> **)
                       ((long)this + 0x10),(long)offset);
  *pSVar5 = dVar1 * 0.0;
  dVar1 = *(double *)((long)this + 0x18);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (*(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> **)
                       ((long)this + 0x10),(long)(offset + 1));
  *pSVar5 = (double)(bVar3 * local_58 + (ulong)!bVar3 * (local_58 ^ 0x8000000000000000)) * dVar1;
  dVar1 = *(double *)((long)this + 0x18);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     (*(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> **)
                       ((long)this + 0x10),(long)(offset + 2));
  *pSVar5 = (double)(bVar3 * local_50 + (ulong)!bVar3 * (local_50 ^ 0x8000000000000000)) * dVar1;
  return true;
}

Assistant:

virtual bool OnReportContact(
                const ChVector<>& pA,             ///< contact pA
                const ChVector<>& pB,             ///< contact pB
                const ChMatrix33<>& plane_coord,  ///< contact plane coordsystem (A column 'X' is contact normal)
                const double& distance,           ///< contact distance
                const double& eff_radius,         ///< effective radius of curvature at contact
                const ChVector<>& react_forces,   ///< react.forces (if already computed). In coordsystem 'plane_coord'
                const ChVector<>& react_torques,  ///< react.torques, if rolling friction (if already computed).
                ChContactable* contactobjA,  ///< model A (note: some containers may not support it and could be nullptr)
                ChContactable* contactobjB,  ///< model B (note: some containers may not support it and could be nullptr)
                const int offset  ///< offset of the first constraint (the normal component) in the vector of lagrangian multipliers, if already book-keeped
            ) {
                // Modify the Ct term in Qc only if the contact is touching a feeder object:
                if ((myfeeder->GetFeederObject().get() == contactobjA) || (myfeeder->GetFeederObject().get() == contactobjB)) {

                    // position of contact respect to the vibration mode reference, defining the screw motion 
                    ChVector<> local_rad = myfeeder->reference.TransformParentToLocal(pB);
                    // speed of the contact point, on the feeder (can be +/-), given the six values of the eigenvector screw motion
                    ChVector<> local_pseudovel = ChVector<>(myfeeder->v_x, myfeeder->v_y, myfeeder->v_z) +
                        Vcross(ChVector<>(myfeeder->w_x, myfeeder->w_y, myfeeder->w_z), local_rad);
                    ChVector<> pseudovel = myfeeder->reference.TransformDirectionLocalToParent(local_pseudovel);
                    // speed in the reference of the contact
                    ChVector<> contact_pseudovel = plane_coord.transpose() * pseudovel;

                    // The -Ct term to impose in the constraint.
                    // Note on signs: the Ct term should be negative for imposing positive contact-relative velocity, because of sign conventions in chrono.
                    ChVector<> contact_Ct; 
                    
                    // Heuristic formula: compute the tangential imposed speed, assuming other object is hit/moved only in ascending direction, and 
                    // assuming the speed is constant in all ascending phase (whereas it would be sinusoidal in reality, but
                    // would need some info on which point of the sinusoid, on average, is hit, and this might require some 
                    // statistical data or some info like gravity acceleration and frequency, which are not needed in the simple formula below)

                    if (contact_pseudovel.x() >= 0)  
                        contact_Ct = -contact_pseudovel;
                    else
                        contact_Ct = contact_pseudovel;

                    // Final touch: set the normal component of Ct as zero, to avoid unnecessary "pop corn" effect, that
                    // should tend to zero anyway in high frequency feeders:
                    contact_Ct.x() = 0;

                    // Write the Ct term in the Qc vector, as required by IntLoadConstraint_Ct
                    (*Qc)(offset) = contact_Ct.x() * c; // Ct =dC/dt term, N normal direction (
                    (*Qc)(offset + 1) = contact_Ct.y() * c; // Ct =dC/dt term, Tu direction 
                    (*Qc)(offset + 2) = contact_Ct.z() * c; // Ct =dC/dt term, Tv direction 
                }
                return true;
            }